

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

uintptr_t ptrie_lookup(PTrie *ptrie,uintptr_t key)

{
  uint uVar1;
  bool bVar2;
  ulong *puStack_28;
  int branch;
  uintptr_t *lastKey;
  PTrieNode *node;
  uintptr_t key_local;
  PTrie *ptrie_local;
  
  spinlock_acquire(&ptrie->lock);
  lastKey = ptrie->root->keys;
  puStack_28 = (ulong *)0x0;
  for (; ((ulong)lastKey & 1) == 0; lastKey = (uintptr_t *)lastKey[(long)(int)uVar1 + 2]) {
    uVar1 = (uint)(key >> ((byte)*lastKey & 0x3f)) & 1;
    puStack_28 = lastKey + (int)uVar1;
  }
  bVar2 = false;
  if (puStack_28 != (ulong *)0x0) {
    bVar2 = (*puStack_28 & 0xffffffffffffff00) == key;
  }
  if (!bVar2) {
    __assert_fail("lastKey && (*lastKey & ~0xFF) == key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                  ,0x203,"uintptr_t ptrie_lookup(PTrie *, uintptr_t)");
  }
  ptrie->lock = 0;
  return (ulong)lastKey & 0xfffffffffffffffe;
}

Assistant:

static uintptr_t ptrie_lookup(PTrie* ptrie, uintptr_t key)
{
	SPINLOCK_ACQUIRE(&ptrie->lock);
	PTrieNode* node = ptrie->root;
	uintptr_t* lastKey = NULL;
	while (!((uintptr_t)node & 1))
	{
		int branch = (key >> (node->keys[0] & 0xFF)) & 1;
		lastKey = &node->keys[branch];
		node = node->childNodes[branch];
	}
	LTALLOC_ASSERT(lastKey && (*lastKey & ~0xFF) == key);
	SPINLOCK_RELEASE(&ptrie->lock);
	return (uintptr_t)node & ~1;
}